

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoInsertValue
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this,
          iterator position,value_type *value)

{
  basic_string<char,_eastl::allocator> **ppbVar1;
  basic_string<char,_eastl::allocator> *pbVar2;
  int iVar3;
  basic_string<char,_eastl::allocator> *pbVar4;
  generic_iterator<eastl::basic_string<char,_eastl::allocator>_*,_void> gVar5;
  uint n;
  
  pbVar2 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
           mpEnd;
  if (pbVar2 == (this->
                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                mpCapacity) {
    iVar3 = (int)((ulong)((long)pbVar2 -
                         (long)(this->
                               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                               ).mpBegin) >> 5);
    n = 1;
    if (iVar3 != 0) {
      n = iVar3 * 2;
    }
    pbVar4 = VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoAllocate
                       (&this->
                         super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                        ,n);
    gVar5 = uninitialized_copy_impl<eastl::generic_iterator<eastl::basic_string<char,eastl::allocator>*,void>,eastl::generic_iterator<eastl::basic_string<char,eastl::allocator>*,void>>
                      ((this->
                       super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                       ).mpBegin,position,pbVar4);
    basic_string<char,_eastl::allocator>::basic_string(gVar5.mIterator,value);
    gVar5 = uninitialized_copy_impl<eastl::generic_iterator<eastl::basic_string<char,eastl::allocator>*,void>,eastl::generic_iterator<eastl::basic_string<char,eastl::allocator>*,void>>
                      (position,(this->
                                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                                ).mpEnd,gVar5.mIterator + 1);
    DoDestroyValues(this,(this->
                         super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                         ).mpBegin,
                    (this->
                    super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
                    .mpEnd);
    pbVar2 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpBegin;
    if (pbVar2 != (basic_string<char,_eastl::allocator> *)0x0) {
      operator_delete__(pbVar2);
    }
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpBegin
         = pbVar4;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd =
         gVar5.mIterator;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
    mpCapacity = pbVar4 + n;
  }
  else {
    basic_string<char,_eastl::allocator>::basic_string(pbVar2,pbVar2 + -1);
    pbVar4 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpEnd;
    copy_backward_impl<false,std::random_access_iterator_tag>::
    do_copy<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
              (position,pbVar4 + -1,pbVar4);
    basic_string<char,_eastl::allocator>::operator=
              (position,value + (value < pbVar2 && position <= value));
    ppbVar1 = &(this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpEnd;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, value_type&& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(std::forward<T>(*(mpEnd - 1)));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(std::forward<T>(value));
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }